

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

float mpack_node_float(mpack_node_t node)

{
  mpack_error_t mVar1;
  mpack_node_data_t *pmVar2;
  float local_24;
  mpack_node_t node_local;
  
  pmVar2 = node.data;
  mVar1 = mpack_node_error(node);
  if (mVar1 == mpack_ok) {
    if (pmVar2->type == mpack_type_uint) {
      local_24 = (float)(ulong)(pmVar2->value).i;
      node_local.tree._4_4_ = local_24;
    }
    else if (pmVar2->type == mpack_type_int) {
      node_local.tree._4_4_ = (float)(pmVar2->value).i;
    }
    else if (pmVar2->type == mpack_type_float) {
      node_local.tree._4_4_ = (pmVar2->value).f;
    }
    else if (pmVar2->type == mpack_type_double) {
      node_local.tree._4_4_ = (float)(pmVar2->value).d;
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree._4_4_ = 0.0;
    }
  }
  else {
    node_local.tree._4_4_ = 0.0;
  }
  return node_local.tree._4_4_;
}

Assistant:

MPACK_INLINE float mpack_node_float(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0.0f;

    if (node.data->type == mpack_type_uint)
        return (float)node.data->value.u;
    else if (node.data->type == mpack_type_int)
        return (float)node.data->value.i;
    else if (node.data->type == mpack_type_float)
        return node.data->value.f;
    else if (node.data->type == mpack_type_double)
        return (float)node.data->value.d;

    mpack_node_flag_error(node, mpack_error_type);
    return 0.0f;
}